

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto,FlatAllocator *alloc)

{
  Tables *this_00;
  DescriptorPool *pDVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  once_flag *__dest;
  key_arg<int> kVar2;
  FlatAllocator *pFVar3;
  bool bVar4;
  bool bVar5;
  Edition EVar6;
  int iVar7;
  int iVar8;
  int32_t iVar9;
  ulong uVar10;
  string *psVar11;
  FeatureResolver *__args;
  SourceCodeInfo *pSVar12;
  FileDescriptorTables *pFVar13;
  const_iterator __first;
  const_iterator __last;
  difference_type dVar14;
  FileDescriptor **ppFVar15;
  InternalMetadata this_01;
  void *__src;
  size_t __n;
  long lVar16;
  int *piVar17;
  FileDescriptor *pFVar18;
  Descriptor *pDVar19;
  DescriptorProto *pDVar20;
  EnumDescriptor *pEVar21;
  EnumDescriptorProto *proto_00;
  ServiceDescriptor *pSVar22;
  ServiceDescriptorProto *proto_01;
  pointer pOVar23;
  FieldDescriptorProto *proto_02;
  reference pOVar24;
  DescriptorBuilder *in_R8;
  string_view sVar25;
  iterator iVar26;
  anon_class_16_2_f782e422 visitor;
  anon_class_16_2_f8590ad5 visitor_00;
  int local_4d4;
  int i_11;
  __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
  local_4c8;
  __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
  local_4c0;
  iterator iter_1;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:659:7)>
  local_49a;
  iterator iStack_498;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:659:7)>
  cleanup;
  __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
  local_490;
  iterator iter;
  OptionInterpreter option_interpreter;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int local_3cc;
  int index_1;
  int i_6;
  int weak_dependency_count;
  int i_5;
  FileDescriptor *local_3b0;
  int local_3a8;
  int local_3a4;
  int index;
  int i_4;
  int public_dependency_count;
  int i_3;
  char *name_data;
  void *data;
  int i_2;
  int total_char_size;
  iterator local_368;
  iterator local_358;
  string_view local_348;
  undefined1 local_338 [8];
  FlatAllocator lazy_dep_alloc;
  DescriptorBuilder *local_238;
  FileDescriptor *dependency;
  bool local_220;
  key_arg<int> local_218;
  byte local_211;
  int i_1;
  bool need_lazy_deps;
  int32_t local_1f8;
  int local_1f4;
  undefined1 local_1f0 [4];
  int i;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  weak_deps;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  seen_dependencies;
  char local_189;
  string_view local_188;
  string_view local_178;
  string_view local_168;
  string_view local_158;
  undefined4 local_144;
  anon_class_8_1_6971b95b local_140;
  VoidPtr local_138;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_130;
  string_view local_128;
  string_view local_118;
  string_view local_108;
  SourceCodeInfo *local_f8;
  SourceCodeInfo *info;
  VoidPtr local_e8;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_e0;
  string_view local_d8;
  undefined1 local_b8 [8];
  StatusOr<google::protobuf::FeatureResolver> feature_resolver;
  FeatureSetDefaults *defaults;
  VoidPtr local_50;
  Invoker<std::__cxx11::basic_string<char>_> local_48;
  string_view local_40;
  DescriptorBuilder *local_30;
  FileDescriptor *result;
  FlatAllocator *alloc_local;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  result = (FileDescriptor *)alloc;
  alloc_local = (FlatAllocator *)proto;
  proto_local = (FileDescriptorProto *)this;
  local_30 = (DescriptorBuilder *)
             anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::AllocateArray<google::protobuf::FileDescriptor>
                       (&alloc->
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ,1);
  this->file_ = (FileDescriptor *)local_30;
  bVar4 = FileDescriptorProto::has_edition((FileDescriptorProto *)alloc_local);
  if (bVar4) {
    EVar6 = FileDescriptorProto::edition((FileDescriptorProto *)alloc_local);
    this->file_->edition_ = EVar6;
  }
  else {
    FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)alloc_local);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      psVar11 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)alloc_local);
      bVar4 = std::operator==(psVar11,"proto2");
      if (!bVar4) {
        psVar11 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)alloc_local);
        bVar4 = std::operator==(psVar11,"proto3");
        if (bVar4) {
          this->file_->edition_ = EDITION_PROTO3;
        }
        else {
          this->file_->edition_ = EDITION_UNKNOWN;
          psVar11 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alloc_local);
          local_40 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
          pFVar3 = alloc_local;
          defaults = (FeatureSetDefaults *)alloc_local;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__0,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_50,
                     (anon_class_8_1_a879b908 *)&defaults);
          in_R8 = (DescriptorBuilder *)0xb;
          make_error.invoker_ = local_48;
          make_error.ptr_.obj = local_50.obj;
          AddError(this,local_40,(Message *)pFVar3,OTHER,make_error);
        }
        goto LAB_001fc5e5;
      }
    }
    this->file_->edition_ = EDITION_PROTO2;
  }
LAB_001fc5e5:
  feature_resolver.super_StatusOrData<google::protobuf::FeatureResolver>.field_1._72_8_ =
       DescriptorPool::GetFeatureSetDefaults(this->pool_);
  FeatureResolver::Create
            ((StatusOr<google::protobuf::FeatureResolver> *)local_b8,this->file_->edition_,
             (FeatureSetDefaults *)
             feature_resolver.super_StatusOrData<google::protobuf::FeatureResolver>.field_1._72_8_);
  bVar4 = absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::ok
                    ((StatusOr<google::protobuf::FeatureResolver> *)local_b8);
  if (bVar4) {
    __args = absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::value
                       ((StatusOr<google::protobuf::FeatureResolver> *)local_b8);
    std::optional<google::protobuf::FeatureResolver>::emplace<google::protobuf::FeatureResolver>
              (&this->feature_resolver_,__args);
  }
  else {
    psVar11 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alloc_local);
    local_d8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
    pFVar3 = alloc_local;
    info = (SourceCodeInfo *)local_b8;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__1,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_e8,(anon_class_8_1_4582bdad *)&info);
    in_R8 = (DescriptorBuilder *)0xa;
    make_error_00.invoker_ = p_Stack_e0;
    make_error_00.ptr_.obj = local_e8.obj;
    AddError(this,local_d8,(Message *)pFVar3,EDITIONS,make_error_00);
  }
  *(undefined1 *)((long)&(((Message *)&local_30->pool_)->super_MessageLite)._vptr_MessageLite + 1) =
       0;
  *(undefined1 *)((long)&(((Message *)&local_30->pool_)->super_MessageLite)._vptr_MessageLite + 2) =
       0;
  local_f8 = (SourceCodeInfo *)0x0;
  bVar4 = FileDescriptorProto::has_source_code_info((FileDescriptorProto *)alloc_local);
  if (bVar4) {
    local_f8 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocateArray<google::protobuf::SourceCodeInfo>
                         ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           *)result,1);
    pSVar12 = FileDescriptorProto::source_code_info((FileDescriptorProto *)alloc_local);
    SourceCodeInfo::operator=(local_f8,pSVar12);
    (local_30->filename_)._M_string_length = (size_type)local_f8;
  }
  else {
    pSVar12 = SourceCodeInfo::default_instance();
    (local_30->filename_)._M_string_length = (size_type)pSVar12;
  }
  pFVar13 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FileDescriptorTables>
                      ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        *)result,1);
  this->file_tables_ = pFVar13;
  this->file_->tables_ = this->file_tables_;
  bVar4 = FileDescriptorProto::has_name((FileDescriptorProto *)alloc_local);
  if (!bVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"");
    in_R8 = (DescriptorBuilder *)0xb;
    AddError(this,local_108,(Message *)alloc_local,OTHER,"Missing field: FileDescriptorProto.name.")
    ;
  }
  pFVar18 = result;
  psVar11 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alloc_local);
  psVar11 = protobuf::(anonymous_namespace)::
            FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
            ::AllocateStrings<std::__cxx11::string_const&>
                      ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        *)pFVar18,psVar11);
  ((InternalMetadata *)&local_30->tables_)->ptr_ = (intptr_t)psVar11;
  bVar4 = FileDescriptorProto::has_package((FileDescriptorProto *)alloc_local);
  pFVar18 = result;
  if (bVar4) {
    psVar11 = FileDescriptorProto::package_abi_cxx11_((FileDescriptorProto *)alloc_local);
    psVar11 = protobuf::(anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::AllocateStrings<std::__cxx11::string_const&>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)pFVar18,psVar11);
    *(string **)&local_30->deferred_validation_ = psVar11;
  }
  else {
    psVar11 = protobuf::(anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::AllocateStrings<char_const(&)[1]>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)result,(char (*) [1])0x6c9290);
    *(string **)&local_30->deferred_validation_ = psVar11;
  }
  local_30->error_collector_ = (ErrorCollector *)this->pool_;
  local_118 = FileDescriptor::name((FileDescriptor *)local_30);
  sVar25._M_str = (char *)0x0;
  sVar25._M_len = (size_t)local_118._M_str;
  bVar4 = absl::lts_20250127::StrContains
                    ((lts_20250127 *)local_118._M_len,sVar25,(char)local_118._M_len);
  if (bVar4) {
    local_128 = FileDescriptor::name((FileDescriptor *)local_30);
    pFVar3 = alloc_local;
    local_140.result = (FileDescriptor **)&local_30;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__2,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_138,&local_140);
    make_error_01.invoker_ = p_Stack_130;
    make_error_01.ptr_.obj = local_138.obj;
    AddError(this,local_128,(Message *)pFVar3,NAME,make_error_01);
    this_local = (DescriptorBuilder *)0x0;
    local_144 = 1;
  }
  else {
    bVar4 = DescriptorPool::Tables::AddFile(this->tables_,(FileDescriptor *)local_30);
    if (bVar4) {
      local_168 = FileDescriptor::package((FileDescriptor *)local_30);
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_168);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        local_178 = FileDescriptor::package((FileDescriptor *)local_30);
        __first = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_178);
        local_188 = FileDescriptor::package((FileDescriptor *)local_30);
        __last = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_188);
        local_189 = '.';
        dVar14 = std::count<char_const*,char>(__first,__last,&local_189);
        if (100 < dVar14) {
          sVar25 = FileDescriptor::package((FileDescriptor *)local_30);
          AddError(this,sVar25,(Message *)alloc_local,NAME,"Exceeds Maximum Package Depth");
          this_local = (DescriptorBuilder *)0x0;
          local_144 = 1;
          goto LAB_001fe259;
        }
        sVar25 = FileDescriptor::package((FileDescriptor *)local_30);
        in_R8 = local_30;
        AddPackage(this,sVar25,(Message *)alloc_local,(FileDescriptor *)local_30,true);
      }
      absl::lts_20250127::
      flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)((long)&weak_deps.
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                 .settings_.
                                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                 .
                                 super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                 .value.heap_or_soo_ + 8));
      iVar7 = FileDescriptorProto::dependency_size((FileDescriptorProto *)alloc_local);
      pFVar18 = result;
      *(int *)((long)&(local_30->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x10) = iVar7;
      iVar7 = FileDescriptorProto::dependency_size((FileDescriptorProto *)alloc_local);
      ppFVar15 = protobuf::(anonymous_namespace)::
                 FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                 ::AllocateArray<google::protobuf::FileDescriptor_const*>
                           ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                             *)pFVar18,iVar7);
      *(FileDescriptor ***)
       ((long)&(local_30->feature_resolver_).
               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
               super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
               defaults_ + 0x28) = ppFVar15;
      ((InternalMetadata *)
      ((long)&(local_30->feature_resolver_).
              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
              super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
              defaults_ + 8))->ptr_ = 0;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::clear(&(this->unused_dependency_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             );
      absl::lts_20250127::
      flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                       *)local_1f0);
      local_1f4 = 0;
      while( true ) {
        iVar7 = local_1f4;
        iVar8 = FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)alloc_local);
        if (iVar8 <= iVar7) break;
        local_1f8 = FileDescriptorProto::weak_dependency
                              ((FileDescriptorProto *)alloc_local,local_1f4);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::insert((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
                  *)&i_1,(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)local_1f0,&local_1f8);
        local_1f4 = local_1f4 + 1;
      }
      local_211 = 0;
      local_218 = 0;
      while( true ) {
        kVar2 = local_218;
        iVar7 = FileDescriptorProto::dependency_size((FileDescriptorProto *)alloc_local);
        if (iVar7 <= kVar2) break;
        psVar11 = FileDescriptorProto::dependency_abi_cxx11_
                            ((FileDescriptorProto *)alloc_local,local_218);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                    *)&dependency,
                   (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)((long)&weak_deps.
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                              .settings_.
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                              .value.heap_or_soo_ + 8),psVar11);
        if (((local_220 ^ 0xffU) & 1) != 0) {
          AddTwiceListedError(this,(FileDescriptorProto *)alloc_local,local_218);
        }
        this_00 = this->tables_;
        psVar11 = FileDescriptorProto::dependency_abi_cxx11_
                            ((FileDescriptorProto *)alloc_local,local_218);
        sVar25 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
        local_238 = (DescriptorBuilder *)DescriptorPool::Tables::FindFile(this_00,sVar25);
        if ((local_238 == (DescriptorBuilder *)0x0) &&
           (this->pool_->underlay_ != (DescriptorPool *)0x0)) {
          pDVar1 = this->pool_->underlay_;
          psVar11 = FileDescriptorProto::dependency_abi_cxx11_
                              ((FileDescriptorProto *)alloc_local,local_218);
          sVar25 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
          lazy_dep_alloc.
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          .used_.payload_._48_8_ = sVar25._M_len;
          local_238 = (DescriptorBuilder *)DescriptorPool::FindFileByName(pDVar1,sVar25);
        }
        if (local_238 == local_30) {
          this_local = (DescriptorBuilder *)0x0;
          goto LAB_001fe225;
        }
        if (local_238 == (DescriptorBuilder *)0x0) {
          if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
            if ((this->pool_->allow_unknown_ & 1U) == 0) {
              if ((this->pool_->enforce_weak_ & 1U) == 0) {
                bVar4 = absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        ::contains<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                         *)local_1f0,&local_218);
                if (bVar4) goto LAB_001fd07c;
              }
              AddImportError(this,(FileDescriptorProto *)alloc_local,local_218);
            }
            else {
LAB_001fd07c:
              internal::FlatAllocator::FlatAllocator((FlatAllocator *)local_338);
              anon_unknown_24::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::PlanArray<google::protobuf::FileDescriptor>
                        ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          *)local_338,1);
              protobuf::(anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::PlanArray<std::__cxx11::string>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)local_338,1);
              protobuf::(anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)local_338,&this->tables_);
              pDVar1 = this->pool_;
              psVar11 = FileDescriptorProto::dependency_abi_cxx11_
                                  ((FileDescriptorProto *)alloc_local,local_218);
              sVar25 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
              local_348 = sVar25;
              local_238 = (DescriptorBuilder *)
                          DescriptorPool::NewPlaceholderFileWithMutexHeld
                                    (pDVar1,sVar25,(FlatAllocator *)local_338);
            }
          }
        }
        else {
          bVar4 = false;
          if ((this->pool_->enforce_dependencies_ & 1U) != 0) {
            pDVar1 = this->pool_;
            psVar11 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alloc_local);
            iVar26 = (iterator)
                     absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                     ::find<std::__cxx11::string>
                               ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                                 *)&pDVar1->direct_input_files_,psVar11);
            local_358 = iVar26;
            iVar26 = (iterator)
                     absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                            *)&this->pool_->direct_input_files_);
            local_368 = iVar26;
            bVar5 = absl::lts_20250127::container_internal::operator!=
                              ((const_iterator *)&local_358,(const_iterator *)&local_368);
            bVar4 = false;
            if (bVar5) {
              iVar7 = FileDescriptor::public_dependency_count((FileDescriptor *)local_238);
              bVar4 = iVar7 == 0;
            }
          }
          if (bVar4) {
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::insert<const_google::protobuf::FileDescriptor_*,_0>
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
                        *)&i_2,&(this->unused_dependency_).
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ,(FileDescriptor **)&local_238);
          }
        }
        (*(FileDescriptor ***)
          ((long)&(local_30->feature_resolver_).
                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                  super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                  _M_value.defaults_ + 0x28))[local_218] = (FileDescriptor *)local_238;
        if (((this->pool_->lazily_build_dependencies_ & 1U) != 0) &&
           (local_238 == (DescriptorBuilder *)0x0)) {
          local_211 = 1;
        }
        local_218 = local_218 + 1;
      }
      if ((local_211 & 1) != 0) {
        data._4_4_ = 0;
        data._0_4_ = 0;
        while( true ) {
          iVar7 = (int)data;
          iVar8 = FileDescriptorProto::dependency_size((FileDescriptorProto *)alloc_local);
          if (iVar8 <= iVar7) break;
          if ((*(FileDescriptor ***)
                ((long)&(local_30->feature_resolver_).
                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                        _M_payload.
                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                        .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                        _M_value.defaults_ + 0x28))[(int)data] == (FileDescriptor *)0x0) {
            FileDescriptorProto::dependency_abi_cxx11_((FileDescriptorProto *)alloc_local,(int)data)
            ;
            iVar7 = std::__cxx11::string::size();
            data._4_4_ = iVar7 + data._4_4_;
          }
          data._4_4_ = data._4_4_ + 1;
          data._0_4_ = (int)data + 1;
        }
        this_01.ptr_ = (intptr_t)DescriptorPool::Tables::AllocateBytes(this->tables_,data._4_4_ + 4)
        ;
        name_data = (char *)this_01.ptr_;
        absl::lts_20250127::once_flag::once_flag((once_flag *)this_01.ptr_);
        ((InternalMetadata *)
        ((long)&(local_30->feature_resolver_).
                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
                defaults_ + 8))->ptr_ = this_01.ptr_;
        i_4 = 0;
        _public_dependency_count =
             (once_flag *)
             (((InternalMetadata *)
              ((long)&(local_30->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                      _M_value.defaults_ + 8))->ptr_ + 4);
        while( true ) {
          iVar7 = i_4;
          iVar8 = FileDescriptorProto::dependency_size((FileDescriptorProto *)alloc_local);
          __dest = _public_dependency_count;
          if (iVar8 <= iVar7) break;
          if ((*(FileDescriptor ***)
                ((long)&(local_30->feature_resolver_).
                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                        _M_payload.
                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                        .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                        _M_value.defaults_ + 0x28))[i_4] == (FileDescriptor *)0x0) {
            FileDescriptorProto::dependency_abi_cxx11_((FileDescriptorProto *)alloc_local,i_4);
            __src = (void *)std::__cxx11::string::data();
            FileDescriptorProto::dependency_abi_cxx11_((FileDescriptorProto *)alloc_local,i_4);
            __n = std::__cxx11::string::size();
            memcpy(__dest,__src,__n);
            FileDescriptorProto::dependency_abi_cxx11_((FileDescriptorProto *)alloc_local,i_4);
            lVar16 = std::__cxx11::string::size();
            _public_dependency_count =
                 (once_flag *)
                 ((long)&(_public_dependency_count->control_).super___atomic_base<unsigned_int>._M_i
                 + lVar16);
          }
          *(undefined1 *)
           &(_public_dependency_count->control_).super___atomic_base<unsigned_int>._M_i = 0;
          i_4 = i_4 + 1;
          _public_dependency_count =
               (once_flag *)
               ((long)&(_public_dependency_count->control_).super___atomic_base<unsigned_int>._M_i +
               1);
        }
      }
      pFVar18 = result;
      index = 0;
      iVar7 = FileDescriptorProto::public_dependency_size((FileDescriptorProto *)alloc_local);
      piVar17 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<int>
                          ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                            *)pFVar18,iVar7);
      *(int **)((long)&(local_30->feature_resolver_).
                       super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                       _M_payload.
                       super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                       .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                       _M_value.defaults_ + 0x30) = piVar17;
      local_3a4 = 0;
      while( true ) {
        iVar7 = local_3a4;
        iVar8 = FileDescriptorProto::public_dependency_size((FileDescriptorProto *)alloc_local);
        if (iVar8 <= iVar7) break;
        iVar9 = FileDescriptorProto::public_dependency((FileDescriptorProto *)alloc_local,local_3a4)
        ;
        local_3a8 = iVar9;
        if (iVar9 < 0) {
LAB_001fd6c1:
          psVar11 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alloc_local);
          sVar25 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
          in_R8 = (DescriptorBuilder *)0xb;
          AddError(this,sVar25,(Message *)alloc_local,OTHER,"Invalid public dependency index.");
        }
        else {
          iVar7 = FileDescriptorProto::dependency_size((FileDescriptorProto *)alloc_local);
          if (iVar7 <= iVar9) goto LAB_001fd6c1;
          iVar7 = index + 1;
          *(int *)(*(long *)((long)&(local_30->feature_resolver_).
                                    super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                    .super__Optional_payload_base<google::protobuf::FeatureResolver>
                                    ._M_payload._M_value.defaults_ + 0x30) + (long)index * 4) =
               local_3a8;
          index = iVar7;
          if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
            local_3b0 = FileDescriptor::dependency((FileDescriptor *)local_30,local_3a8);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::erase<google::protobuf::FileDescriptor_const*>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)&this->unused_dependency_,&local_3b0);
          }
        }
        local_3a4 = local_3a4 + 1;
      }
      *(int *)((long)&(local_30->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x14) = index;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::clear(&(this->dependencies_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             );
      if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
        i_6 = 0;
        while( true ) {
          iVar7 = FileDescriptor::dependency_count((FileDescriptor *)local_30);
          if (iVar7 <= i_6) break;
          pFVar18 = FileDescriptor::dependency((FileDescriptor *)local_30,i_6);
          RecordPublicDependencies(this,pFVar18);
          i_6 = i_6 + 1;
        }
      }
      pFVar18 = result;
      index_1 = 0;
      iVar7 = FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)alloc_local);
      piVar17 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<int>
                          ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                            *)pFVar18,iVar7);
      *(int **)((long)&(local_30->feature_resolver_).
                       super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                       _M_payload.
                       super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                       .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                       _M_value.defaults_ + 0x38) = piVar17;
      local_3cc = 0;
      while( true ) {
        iVar7 = FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)alloc_local);
        if (iVar7 <= local_3cc) break;
        iVar9 = FileDescriptorProto::weak_dependency((FileDescriptorProto *)alloc_local,local_3cc);
        if (iVar9 < 0) {
LAB_001fd8e8:
          psVar11 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alloc_local);
          sVar25 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
          in_R8 = (DescriptorBuilder *)0xb;
          AddError(this,sVar25,(Message *)alloc_local,OTHER,"Invalid weak dependency index.");
        }
        else {
          iVar7 = FileDescriptorProto::dependency_size((FileDescriptorProto *)alloc_local);
          if (iVar7 <= iVar9) goto LAB_001fd8e8;
          (*(int **)((long)&(local_30->feature_resolver_).
                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                            _M_payload.
                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                            _M_payload._M_value.defaults_ + 0x38))[index_1] = iVar9;
          index_1 = index_1 + 1;
        }
        local_3cc = local_3cc + 1;
      }
      *(int *)((long)&(local_30->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x18) = index_1;
      iVar7 = FileDescriptorProto::message_type_size((FileDescriptorProto *)alloc_local);
      pFVar18 = result;
      *(int *)((long)&(local_30->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x1c) = iVar7;
      iVar7 = FileDescriptorProto::message_type_size((FileDescriptorProto *)alloc_local);
      pDVar19 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::Descriptor>
                          ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                            *)pFVar18,iVar7);
      *(Descriptor **)
       ((long)&(local_30->feature_resolver_).
               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
               super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
               defaults_ + 0x40) = pDVar19;
      i_9 = 0;
      while( true ) {
        iVar7 = FileDescriptorProto::message_type_size((FileDescriptorProto *)alloc_local);
        if (iVar7 <= i_9) break;
        pDVar20 = FileDescriptorProto::message_type((FileDescriptorProto *)alloc_local,i_9);
        in_R8 = (DescriptorBuilder *)result;
        BuildMessage(this,pDVar20,(Descriptor *)0x0,
                     *(Descriptor **)
                      ((long)&(local_30->feature_resolver_).
                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                              _M_payload.
                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                              .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                              _M_payload._M_value.defaults_ + 0x40) + i_9,(FlatAllocator *)result);
        i_9 = i_9 + 1;
      }
      iVar7 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)alloc_local);
      pFVar18 = result;
      *(int *)((long)&(local_30->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x20) = iVar7;
      iVar7 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)alloc_local);
      pEVar21 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::EnumDescriptor>
                          ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                            *)pFVar18,iVar7);
      *(EnumDescriptor **)
       ((long)&(local_30->feature_resolver_).
               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
               super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
               defaults_ + 0x48) = pEVar21;
      i_10 = 0;
      while( true ) {
        iVar7 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)alloc_local);
        if (iVar7 <= i_10) break;
        proto_00 = FileDescriptorProto::enum_type((FileDescriptorProto *)alloc_local,i_10);
        in_R8 = (DescriptorBuilder *)result;
        BuildEnum(this,proto_00,(Descriptor *)0x0,
                  *(EnumDescriptor **)
                   ((long)&(local_30->feature_resolver_).
                           super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                           _M_payload.
                           super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                           .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                           _M_payload._M_value.defaults_ + 0x48) + i_10,(FlatAllocator *)result);
        i_10 = i_10 + 1;
      }
      iVar7 = FileDescriptorProto::service_size((FileDescriptorProto *)alloc_local);
      pFVar18 = result;
      *(int *)((long)&(local_30->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x24) = iVar7;
      iVar7 = FileDescriptorProto::service_size((FileDescriptorProto *)alloc_local);
      pSVar22 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::ServiceDescriptor>
                          ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                            *)pFVar18,iVar7);
      *(ServiceDescriptor **)
       &(local_30->feature_resolver_).
        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
        super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged = pSVar22;
      option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.super___atomic_base<long>._M_i._4_4_
           = 0;
      while( true ) {
        iVar7 = FileDescriptorProto::service_size((FileDescriptorProto *)alloc_local);
        if (iVar7 <= option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.
                     super___atomic_base<long>._M_i._4_4_) break;
        proto_01 = FileDescriptorProto::service
                             ((FileDescriptorProto *)alloc_local,
                              option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.
                              super___atomic_base<long>._M_i._4_4_);
        in_R8 = (DescriptorBuilder *)result;
        BuildService(this,proto_01,(void *)0x0,
                     *(ServiceDescriptor **)
                      &(local_30->feature_resolver_).
                       super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                       _M_payload.
                       super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                       .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged +
                     option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.
                     super___atomic_base<long>._M_i._4_4_,(FlatAllocator *)result);
        option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.super___atomic_base<long>._M_i.
        _4_4_ = option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.super___atomic_base<long>.
                _M_i._4_4_ + 1;
      }
      iVar7 = FileDescriptorProto::extension_size((FileDescriptorProto *)alloc_local);
      pFVar18 = result;
      *(int *)((long)&(((Message *)&local_30->pool_)->super_MessageLite)._vptr_MessageLite + 4) =
           iVar7;
      iVar7 = FileDescriptorProto::extension_size((FileDescriptorProto *)alloc_local);
      pOVar23 = (pointer)anon_unknown_24::
                         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ::AllocateArray<google::protobuf::FieldDescriptor>
                                   ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                     *)pFVar18,iVar7);
      (local_30->options_to_interpret_).
      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ._M_impl.super__Vector_impl_data._M_start = pOVar23;
      option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.super___atomic_base<long>._M_i._0_4_
           = 0;
      while( true ) {
        iVar7 = FileDescriptorProto::extension_size((FileDescriptorProto *)alloc_local);
        if (iVar7 <= (int)option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.
                          super___atomic_base<long>._M_i) break;
        proto_02 = FileDescriptorProto::extension
                             ((FileDescriptorProto *)alloc_local,
                              (int)option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.
                                   super___atomic_base<long>._M_i);
        in_R8 = (DescriptorBuilder *)result;
        BuildExtension(this,proto_02,(Descriptor *)0x0,
                       (FieldDescriptor *)
                       ((long)&((local_30->options_to_interpret_).
                                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name_scope +
                       (long)(int)option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.
                                  super___atomic_base<long>._M_i * 0x58),(FlatAllocator *)result);
        option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.super___atomic_base<long>._M_i.
        _0_4_ = (int)option_interpreter.dynamic_factory_.prototypes_mutex_.mu_.
                     super___atomic_base<long>._M_i + 1;
      }
      AllocateOptions(this,(FileDescriptorProto *)alloc_local,(FileDescriptor *)local_30,
                      (FlatAllocator *)result);
      CrossLinkFile(this,(FileDescriptor *)local_30,(FileDescriptorProto *)alloc_local);
      bVar4 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
              ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                       *)&this->message_hints_);
      if (!bVar4) {
        SuggestFieldNumbers(this,(FileDescriptor *)local_30,(FileDescriptorProto *)alloc_local);
      }
      if ((this->had_errors_ & 1U) == 0) {
        OptionInterpreter::OptionInterpreter((OptionInterpreter *)&iter,this);
        local_490._M_current =
             (OptionsToInterpret *)
             std::
             vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ::begin(&this->options_to_interpret_);
        while( true ) {
          iStack_498 = std::
                       vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                       ::end(&this->options_to_interpret_);
          bVar4 = __gnu_cxx::operator!=(&local_490,&stack0xfffffffffffffb68);
          if (!bVar4) break;
          pOVar24 = __gnu_cxx::
                    __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
                    ::operator*(&local_490);
          OptionInterpreter::InterpretNonExtensionOptions((OptionInterpreter *)&iter,pOVar24);
          __gnu_cxx::
          __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
          ::operator++(&local_490);
        }
        anon_unknown_24::DisableTracking();
        visitor.alloc = (FlatAllocator *)in_R8;
        visitor.this = (DescriptorBuilder *)result;
        internal::
        VisitDescriptors<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>
                  ((internal *)local_30,(FileDescriptor *)alloc_local,(FileDescriptorProto *)this,
                   visitor);
        absl::lts_20250127::
        Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc:659:7)>
        ::~Cleanup(&local_49a);
        iter_1._M_current = (OptionsToInterpret *)this;
        internal::
        VisitDescriptors<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__4>
                  ((FileDescriptor *)local_30,(FileDescriptorProto *)alloc_local,
                   (anon_class_8_1_8991fb9c)this);
        local_4c0._M_current =
             (OptionsToInterpret *)
             std::
             vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ::begin(&this->options_to_interpret_);
        while( true ) {
          local_4c8._M_current =
               (OptionsToInterpret *)
               std::
               vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
               ::end(&this->options_to_interpret_);
          bVar4 = __gnu_cxx::operator!=(&local_4c0,&local_4c8);
          if (!bVar4) break;
          pOVar24 = __gnu_cxx::
                    __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
                    ::operator*(&local_4c0);
          OptionInterpreter::InterpretOptionExtensions((OptionInterpreter *)&iter,pOVar24);
          __gnu_cxx::
          __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
          ::operator++(&local_4c0);
        }
        std::
        vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ::clear(&this->options_to_interpret_);
        if (local_f8 != (SourceCodeInfo *)0x0) {
          OptionInterpreter::UpdateSourceCodeInfo((OptionInterpreter *)&iter,local_f8);
        }
        OptionInterpreter::~OptionInterpreter((OptionInterpreter *)&iter);
      }
      if (((this->had_errors_ & 1U) == 0) && ((this->pool_->lazily_build_dependencies_ & 1U) == 0))
      {
        internal::
        VisitDescriptors<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__5>
                  ((FileDescriptor *)local_30,(FileDescriptorProto *)alloc_local,
                   (anon_class_8_1_8991fb9c)this);
      }
      if ((this->had_errors_ & 1U) != 0) {
        local_4d4 = 0;
        while( true ) {
          iVar7 = FileDescriptorProto::message_type_size((FileDescriptorProto *)alloc_local);
          if (iVar7 <= local_4d4) break;
          pDVar19 = FileDescriptor::message_type((FileDescriptor *)local_30,local_4d4);
          pDVar20 = FileDescriptorProto::message_type((FileDescriptorProto *)alloc_local,local_4d4);
          DetectMapConflicts(this,pDVar19,pDVar20);
          local_4d4 = local_4d4 + 1;
        }
      }
      if ((this->had_errors_ & 1U) == 0) {
        bVar4 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::empty(&(this->unused_dependency_).
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       );
        if ((!bVar4) && ((this->pool_->lazily_build_dependencies_ & 1U) == 0)) {
          LogUnusedDependency(this,(FileDescriptorProto *)alloc_local,(FileDescriptor *)local_30);
        }
      }
      if (((this->had_errors_ & 1U) == 0) && ((this->pool_->lazily_build_dependencies_ & 1U) == 0))
      {
        visitor_00.proto = (FileDescriptorProto *)in_R8;
        visitor_00.this = (DescriptorBuilder *)alloc_local;
        internal::
        VisitDescriptors<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>
                  ((internal *)local_30,(FileDescriptor *)alloc_local,(FileDescriptorProto *)this,
                   visitor_00);
      }
      if (((this->had_errors_ & 1U) == 0) && ((this->pool_->enforce_naming_style_ & 1U) != 0)) {
        internal::
        VisitDescriptors<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>
                  ((FileDescriptor *)local_30,(FileDescriptorProto *)alloc_local,
                   (anon_class_8_1_8991fb9c)this);
      }
      if ((this->had_errors_ & 1U) == 0) {
        CheckVisibilityRules(this,(FileDescriptor *)local_30,(FileDescriptorProto *)alloc_local);
      }
      if ((this->had_errors_ & 1U) == 0) {
        this_local = local_30;
      }
      else {
        this_local = (DescriptorBuilder *)0x0;
      }
LAB_001fe225:
      local_144 = 1;
      absl::lts_20250127::
      flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::~flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)local_1f0);
      absl::lts_20250127::
      flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)((long)&weak_deps.
                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                  .settings_.
                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                  .value.heap_or_soo_ + 8));
    }
    else {
      psVar11 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alloc_local);
      local_158 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
      AddError(this,local_158,(Message *)alloc_local,OTHER,
               "A file with this name is already in the pool.");
      this_local = (DescriptorBuilder *)0x0;
      local_144 = 1;
    }
  }
LAB_001fe259:
  absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::~StatusOr
            ((StatusOr<google::protobuf::FeatureResolver> *)local_b8);
  return (FileDescriptor *)this_local;
}

Assistant:

FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto, internal::FlatAllocator& alloc) {
  FileDescriptor* result = alloc.AllocateArray<FileDescriptor>(1);
  file_ = result;

  if (proto.has_edition()) {
    file_->edition_ = proto.edition();
  } else if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->edition_ = Edition::EDITION_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->edition_ = Edition::EDITION_PROTO3;
  } else {
    file_->edition_ = Edition::EDITION_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER, [&] {
      return absl::StrCat("Unrecognized syntax: ", proto.syntax());
    });
  }

  const FeatureSetDefaults& defaults = pool_->GetFeatureSetDefaults();

  absl::StatusOr<FeatureResolver> feature_resolver =
      FeatureResolver::Create(file_->edition_, defaults);
  if (!feature_resolver.ok()) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::EDITIONS,
             [&] { return std::string(feature_resolver.status().message()); });
  } else {
    feature_resolver_.emplace(std::move(feature_resolver).value());
  }

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  SourceCodeInfo* info = nullptr;
  if (proto.has_source_code_info()) {
    info = alloc.AllocateArray<SourceCodeInfo>(1);
    *info = proto.source_code_info();
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = alloc.AllocateArray<FileDescriptorTables>(1);
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  result->name_ = alloc.AllocateStrings(proto.name());
  if (proto.has_package()) {
    result->package_ = alloc.AllocateStrings(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = alloc.AllocateStrings("");
  }
  result->pool_ = pool_;

  if (absl::StrContains(result->name(), '\0')) {
    AddError(result->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", result->name(), "\" contains null character.");
    });
    return nullptr;
  }

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    return nullptr;
  }
  if (!result->package().empty()) {
    if (std::count(result->package().begin(), result->package().end(), '.') >
        kPackageLimit) {
      AddError(result->package(), proto, DescriptorPool::ErrorCollector::NAME,
               "Exceeds Maximum Package Depth");
      return nullptr;
    }
    AddPackage(result->package(), proto, result, true);
  }

  // Make sure all dependencies are loaded.
  absl::flat_hash_set<absl::string_view> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      alloc.AllocateArray<const FileDescriptor*>(proto.dependency_size());
  result->dependencies_once_ = nullptr;
  unused_dependency_.clear();
  absl::flat_hash_set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }

  bool need_lazy_deps = false;
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == nullptr && pool_->underlay_ != nullptr) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      return nullptr;
    }

    if (dependency == nullptr) {
      if (!pool_->lazily_build_dependencies_) {
        if (pool_->allow_unknown_ ||
            (!pool_->enforce_weak_ && weak_deps.contains(i))) {
          internal::FlatAllocator lazy_dep_alloc;
          lazy_dep_alloc.PlanArray<FileDescriptor>(1);
          lazy_dep_alloc.PlanArray<std::string>(1);
          lazy_dep_alloc.FinalizePlanning(tables_);
          dependency = pool_->NewPlaceholderFileWithMutexHeld(
              proto.dependency(i), lazy_dep_alloc);
        } else {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->direct_input_files_.find(proto.name()) !=
           pool_->direct_input_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      need_lazy_deps = true;
    }
  }
  if (need_lazy_deps) {
    int total_char_size = 0;
    for (int i = 0; i < proto.dependency_size(); i++) {
      if (result->dependencies_[i] == nullptr) {
        total_char_size += static_cast<int>(proto.dependency(i).size());
      }
      ++total_char_size;  // For NUL char
    }

    void* data = tables_->AllocateBytes(
        static_cast<int>(sizeof(absl::once_flag)) + total_char_size);
    result->dependencies_once_ = ::new (data) absl::once_flag{};
    char* name_data = reinterpret_cast<char*>(result->dependencies_once_ + 1);

    for (int i = 0; i < proto.dependency_size(); i++) {
      if (result->dependencies_[i] == nullptr) {
        memcpy(name_data, proto.dependency(i).data(),
               proto.dependency(i).size());
        name_data += proto.dependency(i).size();
      }
      *name_data++ = '\0';
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ =
      alloc.AllocateArray<int>(proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ =
      alloc.AllocateArray<int>(proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage, nullptr);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, nullptr);
  BUILD_ARRAY(proto, result, service, BuildService, nullptr);
  BUILD_ARRAY(proto, result, extension, BuildExtension, nullptr);

  // Copy options.
  AllocateOptions(proto, result, alloc);

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  if (!message_hints_.empty()) {
    SuggestFieldNumbers(result, proto);
  }

  // Interpret only the non-extension options first, including features and
  // their extensions.  This has to be done in two passes, since option
  // extensions defined in this file may have features attached to them.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretNonExtensionOptions(&(*iter));
    }

    // Handle feature resolution.  This must occur after option interpretation,
    // but before validation.
    {
      auto cleanup = DisableTracking();
      internal::VisitDescriptors(
          *result, proto, [&](const auto& descriptor, const auto& proto) {
            using OptionsT =
                typename std::remove_const<typename std::remove_pointer<
                    decltype(descriptor.options_)>::type>::type;
            using DescriptorT =
                typename std::remove_const<typename std::remove_reference<
                    decltype(descriptor)>::type>::type;

            ResolveFeatures(
                proto, const_cast<DescriptorT*>(&descriptor),
                const_cast<  // NOLINT(google3-runtime-proto-const-cast)
                    OptionsT*>(descriptor.options_),
                alloc);
          });
    }

    // Post-process cleanup for field features.
    internal::VisitDescriptors(
        *result, proto,
        [&](const FieldDescriptor& field, const FieldDescriptorProto& proto) {
          PostProcessFieldFeatures(const_cast<FieldDescriptor&>(field), proto);
        });

    // Interpret any remaining uninterpreted options gathered into
    // options_to_interpret_ during descriptor building.  Cross-linking has made
    // extension options known, so all interpretations should now succeed.
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptionExtensions(&(*iter));
    }
    options_to_interpret_.clear();
    if (info != nullptr) {
      option_interpreter.UpdateSourceCodeInfo(info);
    }
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          ValidateOptions(&descriptor, desc_proto);
        });
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking. Also, don't log unused dependencies if there were previous
  // errors, since the results might be inaccurate.
  if (!had_errors_ && !unused_dependency_.empty() &&
      !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  // Store feature information for deferred validation outside of the database
  // mutex.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          if (descriptor.proto_features_ != &FeatureSet::default_instance()) {
            deferred_validation_.ValidateFeatureLifetimes(
                GetFile(descriptor), {descriptor.proto_features_, &desc_proto,
                                      GetFullName(descriptor), proto.name()});
          }
        });
  }

  if (!had_errors_ && pool_->enforce_naming_style_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          if (internal::InternalFeatureHelper::GetFeatures(descriptor)
                  .enforce_naming_style() == FeatureSet::STYLE2024) {
            ValidateNamingStyle(&descriptor, desc_proto);
          }
        });
  }
  if (!had_errors_) {
    // Check Symbol Visibility Rules.
    CheckVisibilityRules(result, proto);
  }

  if (had_errors_) {
    return nullptr;
  } else {
    return result;
  }
}